

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  int iVar11;
  char flag;
  char buffer [256];
  byte local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  string local_158;
  string local_138 [8];
  
  do {
    sVar3 = read(this->read_fd_,&local_221,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00108bc7;
      }
      if (iVar1 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar1 = this->read_fd_;
            Message::Message((Message *)&local_1b8);
            goto LAB_00108d1f;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_00108bc7;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_00108bc7;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_00108bc7;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/googletest/googletest/src/gtest-death-test.cc"
                           ,0x1f1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_00108bc7;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
  goto LAB_00108bc7;
  while( true ) {
    piVar4 = __errno_location();
    iVar11 = *piVar4;
    if (iVar11 != 4) break;
LAB_00108d1f:
    while( true ) {
      sVar3 = read(iVar1,local_138,0xff);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar2 & 0x7fffffff)) = 0;
      sVar7 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8._M_head_impl + 0x10),(char *)local_138,sVar7);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/googletest/googletest/src/gtest-death-test.cc"
                           ,0x16d);
        StringStreamToString(&local_220,local_1b8._M_head_impl);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        goto LAB_00108e4d;
      }
      piVar4 = __errno_location();
      iVar11 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/googletest/googletest/src/gtest-death-test.cc"
                     ,0x170);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
  GetLastErrnoDescription_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
LAB_00108e4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (local_1b8._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_1b8._M_head_impl + 8))(local_1b8._M_head_impl);
  }
LAB_00108bc7:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_178);
  local_198 = (long *)*plVar5;
  plVar8 = plVar5 + 2;
  if (local_198 == plVar8) {
    local_188 = *plVar8;
    lStack_180 = plVar5[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar8;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_1d8._M_dataplus._M_p = (pointer)*plVar5;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_1d8._M_dataplus._M_p == psVar9) {
    local_1d8.field_2._M_allocated_capacity = *psVar9;
    local_1d8.field_2._8_8_ = plVar5[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar9;
  }
  local_1d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1dc = 0x1f9;
  StreamableToString<int>(&local_158,&local_1dc);
  std::operator+(&local_200,&local_1d8,&local_158);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (local_1b8._M_head_impl == pbVar10) {
    local_1a8 = *(long *)pbVar10;
    lStack_1a0 = plVar5[3];
    local_1b8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8;
  }
  else {
    local_1a8 = *(long *)pbVar10;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)pbVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_220._M_dataplus._M_p = (pointer)*plVar5;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar9) {
    local_220.field_2._M_allocated_capacity = *psVar9;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar9;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar9) {
    local_138[0].field_2._0_8_ = *psVar9;
    local_138[0].field_2._8_8_ = plVar5[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar9;
  }
  local_138[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(local_138);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}